

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O3

EventRegistry * __thiscall
license::LicenseReader::getLicenseDiskFiles
          (EventRegistry *__return_storage_ptr__,LicenseReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *diskFiles)

{
  bool bVar1;
  bool bVar2;
  FUNCTION_RETURN FVar3;
  int *piVar4;
  size_t sVar5;
  long *plVar6;
  size_type *psVar7;
  EVENT_TYPE event;
  bool bVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar10;
  string temptativeLicense;
  ifstream f;
  char fname [4096];
  value_type local_1260;
  undefined1 *local_1240 [2];
  undefined1 local_1230 [16];
  int aiStack_1220 [122];
  char local_1038 [4104];
  
  EventRegistry::EventRegistry(__return_storage_ptr__);
  bVar1 = findLicenseWithExplicitLocation(this,diskFiles,__return_storage_ptr__);
  if ((this->licenseLocation).openFileNearModule == true) {
    memset(local_1038,0,0x1000);
    FVar3 = getModuleName(local_1038);
    if (FVar3 == FUNC_RET_OK) {
      local_1240[0] = local_1230;
      sVar5 = strlen(local_1038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1240,local_1038,local_1038 + sVar5);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_1240);
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_1260.field_2._M_allocated_capacity = *psVar7;
        local_1260.field_2._8_8_ = plVar6[3];
        local_1260._M_dataplus._M_p = (pointer)&local_1260.field_2;
      }
      else {
        local_1260.field_2._M_allocated_capacity = *psVar7;
        local_1260._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_1260._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_1240[0] != local_1230) {
        operator_delete(local_1240[0]);
      }
      std::ifstream::ifstream(local_1240,local_1260._M_dataplus._M_p,_S_in);
      bVar8 = *(int *)((long)aiStack_1220 + *(long *)(local_1240[0] + -0x18)) == 0;
      event = LICENSE_FILE_NOT_FOUND;
      if (bVar8) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(diskFiles,&local_1260);
        event = LICENSE_FILE_FOUND;
      }
      EventRegistry::addEvent(__return_storage_ptr__,event,(uint)!bVar8,&local_1260);
      std::ifstream::close();
      std::ifstream::~ifstream(local_1240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1260._M_dataplus._M_p != &local_1260.field_2) {
        operator_delete(local_1260._M_dataplus._M_p);
      }
    }
    else {
      piVar4 = __errno_location();
      uVar9 = extraout_XMM0_Da;
      uVar10 = extraout_XMM0_Db;
      if (*piVar4 != 0) {
        strerror(*piVar4);
        uVar9 = extraout_XMM0_Da_00;
        uVar10 = extraout_XMM0_Db_00;
      }
      bVar8 = false;
      _log((double)CONCAT44(uVar10,uVar9));
    }
  }
  else {
    bVar8 = false;
  }
  bVar2 = findFileWithEnvironmentVariable(this,diskFiles,__return_storage_ptr__);
  if ((!bVar1 && !bVar8) && !bVar2) {
    EventRegistry::turnEventIntoError(__return_storage_ptr__,ENVIRONMENT_VARIABLE_NOT_DEFINED);
    EventRegistry::turnEventIntoError(__return_storage_ptr__,LICENSE_FILE_NOT_FOUND);
  }
  return __return_storage_ptr__;
}

Assistant:

EventRegistry LicenseReader::getLicenseDiskFiles(vector<string>& diskFiles) {
	EventRegistry eventRegistry;
	bool licenseFoundWithExplicitLocation = findLicenseWithExplicitLocation(
			diskFiles, eventRegistry);
	bool foundNearModule = false;
	if (licenseLocation.openFileNearModule) {
		char fname[MAX_PATH] = { 0 };
		FUNCTION_RETURN fret = getModuleName(fname);
		if (fret == FUNC_RET_OK) {
			string temptativeLicense = string(fname) + ".lic";
			ifstream f(temptativeLicense.c_str());
			if (f.good()) {
				foundNearModule = true;
				diskFiles.push_back(temptativeLicense);
				eventRegistry.addEvent(LICENSE_FILE_FOUND, SVRT_INFO,
						temptativeLicense);
			} else {
				eventRegistry.addEvent(LICENSE_FILE_NOT_FOUND, SVRT_WARN,
						temptativeLicense);
			}
			f.close();
		} else {
			LOG_WARN("Error determining module name.");
		}
	}
	bool licenseFileFoundWithEnvVariable = findFileWithEnvironmentVariable(
			diskFiles, eventRegistry);

	if (!foundNearModule && !licenseFoundWithExplicitLocation
			&& !licenseFileFoundWithEnvVariable) {
		eventRegistry.turnEventIntoError(ENVIRONMENT_VARIABLE_NOT_DEFINED);
		eventRegistry.turnEventIntoError(LICENSE_FILE_NOT_FOUND);
	}
	return eventRegistry;
}